

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O2

ListEntry __thiscall
SortedList<MessageQueue::ListEntry>::Pop(SortedList<MessageQueue::ListEntry> *this)

{
  uint uVar1;
  DListNode<MessageQueue::ListEntry> *node;
  MessageBase *pMVar2;
  ListEntry LVar3;
  
  node = this->head;
  uVar1 = (node->data).time;
  pMVar2 = (node->data).message;
  Remove(this,node);
  LVar3._4_4_ = 0;
  LVar3.time = uVar1;
  LVar3.message = pMVar2;
  return LVar3;
}

Assistant:

T Pop()
    {
        T data = head->data;
        Remove(head);
        return data;
    }